

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprinteg.h
# Opt level: O3

void __thiscall TPZPrInteg<TPZInt1d>::TPZPrInteg(TPZPrInteg<TPZInt1d> *this,int order)

{
  TPZGaussRule *pTVar1;
  int iVar2;
  
  iVar2 = 0;
  TPZInt1d::TPZInt1d(&this->super_TPZInt1d,order,0);
  (this->super_TPZInt1d).super_TPZIntPoints._vptr_TPZIntPoints =
       (_func_int **)&PTR__TPZPrInteg_0181c578;
  if (order < 1) {
    pTVar1 = (TPZGaussRule *)0x0;
  }
  else {
    pTVar1 = TPZIntRuleList::GetRule(&TPZIntRuleList::gIntRuleList,order,0);
    iVar2 = order;
  }
  this->fIntP = pTVar1;
  this->fOrdKsi = iVar2;
  return;
}

Assistant:

TPZPrInteg(int order) : TFather(order)
    {
		if(order>0)
		{
			fIntP   = TPZIntRuleList::gIntRuleList.GetRule(order);
			fOrdKsi = order;
		}
		else
		{
			fOrdKsi = 0;
			fIntP = 0;
		}
    }